

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_Sum(SumForm2 Sum)

{
  uint uVar1;
  int iVar2;
  code *in_RDI;
  byte bVar3;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image input;
  uint8_t intensity;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined2 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  uint32_t *x;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 local_70;
  uint32_t in_stack_ffffffffffffff94;
  uint32_t in_stack_ffffffffffffff98;
  uint8_t in_stack_ffffffffffffff9f;
  uint32_t local_60 [10];
  undefined1 local_38 [47];
  byte local_9;
  code *local_8;
  
  local_8 = in_RDI;
  local_9 = Unit_Test::intensityValue();
  uVar1 = (uint)local_9;
  x = local_60;
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (uint32_t)((ulong)x >> 0x20),(uint32_t)x,'\0','\0');
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
             (Image *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e47ac);
  Unit_Test::generateRoi
            ((Image *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),x,
             (uint32_t *)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT24(uVar4,uVar1))),
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (uint32_t *)0x1e47ca);
  iVar2 = (*local_8)(local_38,local_70,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
                     in_stack_ffffffffffffff84);
  bVar3 = iVar2 == (uint)local_9 * in_stack_ffffffffffffff88 * in_stack_ffffffffffffff84;
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e481b);
  return (bool)(bVar3 & 1);
}

Assistant:

bool form2_Sum(SumForm2 Sum)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        return Sum( input, roiX, roiY, roiWidth, roiHeight ) == intensity * roiWidth * roiHeight;
    }